

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITRecyclableObject.h
# Opt level: O0

JITJavascriptString * JITJavascriptString::FromVar(Var var)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  Var var_local;
  
  uVar3 = Js::JavascriptString::GetOffsetOfpszValue();
  if (uVar3 != 0x10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITRecyclableObject.h"
                       ,0x3a,
                       "(__builtin_offsetof(JITJavascriptString, m_pszValue) == Js::JavascriptString::GetOffsetOfpszValue())"
                       ,
                       "offsetof(JITJavascriptString, m_pszValue) == Js::JavascriptString::GetOffsetOfpszValue()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = Js::JavascriptString::GetOffsetOfcharLength();
  if (uVar3 != 0x18) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITRecyclableObject.h"
                       ,0x3b,
                       "(__builtin_offsetof(JITJavascriptString, m_charLength) == Js::JavascriptString::GetOffsetOfcharLength())"
                       ,
                       "offsetof(JITJavascriptString, m_charLength) == Js::JavascriptString::GetOffsetOfcharLength()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = Is(var);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITRecyclableObject.h"
                       ,0x3c,"(Is(var))","Is(var)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return (JITJavascriptString *)var;
}

Assistant:

static JITJavascriptString * FromVar(Js::Var var)
    {
        Assert(offsetof(JITJavascriptString, m_pszValue) == Js::JavascriptString::GetOffsetOfpszValue());
        Assert(offsetof(JITJavascriptString, m_charLength) == Js::JavascriptString::GetOffsetOfcharLength());
        AssertOrFailFast(Is(var));

        return reinterpret_cast<JITJavascriptString*>(var);
    }